

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg.c
# Opt level: O1

pjpeg_t * pjpeg_create_from_file(char *path,uint32_t flags,int *error)

{
  FILE *__stream;
  size_t __size;
  uint8_t *buf;
  size_t sVar1;
  pjpeg_t *ppVar2;
  
  __stream = fopen(path,"r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    __size = ftell(__stream);
    buf = (uint8_t *)malloc(__size);
    fseek(__stream,0,0);
    sVar1 = fread(buf,1,__size,__stream);
    fclose(__stream);
    if ((long)(int)sVar1 == __size) {
      ppVar2 = pjpeg_create_from_buffer(buf,(int)__size,flags,error);
      free(buf);
      return ppVar2;
    }
    free(buf);
    if (error != (int *)0x0) {
      *error = 1;
    }
  }
  return (pjpeg_t *)0x0;
}

Assistant:

pjpeg_t *pjpeg_create_from_file(const char *path, uint32_t flags, int *error)
{
    FILE *f = fopen(path, "r");
    if (f == NULL)
        return NULL;

    fseek(f, 0, SEEK_END);
    long buflen = ftell(f);

    uint8_t *buf = malloc(buflen);
    fseek(f, 0, SEEK_SET);
    int res = fread(buf, 1, buflen, f);
    fclose(f);
    if (res != buflen) {
        free(buf);
        if (error)
            *error = PJPEG_ERR_FILE;
        return NULL;
    }

    pjpeg_t *pj = pjpeg_create_from_buffer(buf, buflen, flags, error);

    free(buf);
    return pj;
}